

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int stbi_register_loader(stbi_loader *loader)

{
  long lVar1;
  int iVar2;
  
  lVar1 = 0;
  iVar2 = 1;
  while( true ) {
    if (*(stbi_loader **)((long)loaders + lVar1) == loader) {
      return 1;
    }
    if (*(stbi_loader **)((long)loaders + lVar1) == (stbi_loader *)0x0) break;
    iVar2 = iVar2 + 1;
    lVar1 = lVar1 + 8;
    if (lVar1 == 0x100) {
      return 0;
    }
  }
  *(stbi_loader **)((long)loaders + lVar1) = loader;
  max_loaders = iVar2;
  return 1;
}

Assistant:

int stbi_register_loader(stbi_loader *loader)
{
   int i;
   for (i=0; i < MAX_LOADERS; ++i) {
      // already present?
      if (loaders[i] == loader)
         return 1;
      // end of the list?
      if (loaders[i] == NULL) {
         loaders[i] = loader;
         max_loaders = i+1;
         return 1;
      }
   }
   // no room for it
   return 0;
}